

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

wchar_t spell_book_count_spells(player *p,object *obj,_func__Bool_player_ptr_wchar_t *tester)

{
  _Bool _Var1;
  class_book_conflict *pcVar2;
  wchar_t local_38;
  int local_34;
  wchar_t n_spells;
  wchar_t i;
  class_book_conflict *book;
  _func__Bool_player_ptr_wchar_t *tester_local;
  object *obj_local;
  player *p_local;
  
  pcVar2 = player_object_to_book(p,obj);
  local_38 = L'\0';
  if (pcVar2 == (class_book_conflict *)0x0) {
    p_local._4_4_ = L'\0';
  }
  else {
    for (local_34 = 0; local_34 < pcVar2->num_spells; local_34 = local_34 + 1) {
      _Var1 = (*tester)(p,pcVar2->spells[local_34].sidx);
      if (_Var1) {
        local_38 = local_38 + L'\x01';
      }
    }
    p_local._4_4_ = local_38;
  }
  return p_local._4_4_;
}

Assistant:

int spell_book_count_spells(const struct player *p, const struct object *obj,
		bool (*tester)(const struct player *p, int spell))
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	for (i = 0; i < book->num_spells; i++)
		if (tester(p, book->spells[i].sidx))
			n_spells++;

	return n_spells;
}